

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O2

void __thiscall
adios2::utils::Reorganize::
print0<char_const(&)[22],int&,char_const(&)[3],std::__cxx11::string_const&>
          (Reorganize *this,char (*arg) [22],int *args,char (*args_1) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  if (this->m_Rank != 0) {
    return;
  }
  std::operator<<((ostream *)&std::cout,*arg);
  std::ostream::operator<<((ostream *)&std::cout,*args);
  std::operator<<((ostream *)&std::cout,*args_1);
  std::operator<<((ostream *)&std::cout,(string *)args_2);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Reorganize::print0(Arg &&arg, Args &&...args)
{
    if (!m_Rank)
    {
        std::cout << std::forward<Arg>(arg);
        using expander = int[];
        (void)expander{0, (void(std::cout << std::forward<Args>(args)), 0)...};
        std::cout << std::endl;
    }
}